

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTestFixture.cpp
# Opt level: O2

void __thiscall
celero::ThreadTestFixture::startThreads
          (ThreadTestFixture *this,uint64_t threads,uint64_t iterations)

{
  _Head_base<0UL,_celero::ThreadTestFixture::Impl_*,_false> this_00;
  pointer p_Var1;
  _Result<void> *p_Var2;
  _State_baseV2 *__tmp_1;
  _State_baseV2 *__tmp;
  uint64_t uVar3;
  __allocator_type __a2;
  __allocator_type __a2_1;
  __state_type local_b8 [2];
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DigitalInBlue[P]Celero_src_ThreadTestFixture_cpp:58:36)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DigitalInBlue[P]Celero_src_ThreadTestFixture_cpp:58:36)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_98;
  long *local_80;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DigitalInBlue[P]Celero_src_ThreadTestFixture_cpp:58:36)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DigitalInBlue[P]Celero_src_ThreadTestFixture_cpp:58:36)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_78;
  ulong local_68;
  thread local_60;
  undefined8 local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  uint64_t local_48;
  __basic_future<void> local_40;
  
  local_68 = iterations / threads;
  local_48 = threads;
  for (uVar3 = 0; local_48 != uVar3; uVar3 = uVar3 + 1) {
    this_00._M_head_impl =
         (this->pimpl)._pimpl._M_t.
         super___uniq_ptr_impl<celero::ThreadTestFixture::Impl,_std::default_delete<celero::ThreadTestFixture::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_celero::ThreadTestFixture::Impl_*,_std::default_delete<celero::ThreadTestFixture::Impl>_>
         .super__Head_base<0UL,_celero::ThreadTestFixture::Impl_*,_false>._M_head_impl;
    local_b8[0].super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_b8[0].super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (pointer)operator_new(0x60);
    local_98._M_alloc = &__a2;
    (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
    (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
    (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_00151930;
    *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 8) = 0;
    *(undefined4 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x10) = 0;
    (p_Var1->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
    *(undefined4 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x18) = 0;
    *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x20) = 0;
    *(undefined4 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x28) = 0;
    (p_Var1->_M_impl)._M_storage._M_storage.__align =
         (anon_struct_8_0_00000001_for___align)&PTR___Async_state_impl_00151980;
    local_98._M_ptr = p_Var1;
    p_Var2 = (_Result<void> *)operator_new(0x10);
    *(undefined8 *)p_Var2 = 0;
    *(undefined8 *)&p_Var2->field_0x8 = 0;
    std::__future_base::_Result<void>::_Result(p_Var2);
    *(_Result<void> **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x30) = p_Var2;
    *(ThreadTestFixture **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x38) = this;
    *(uint64_t *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x40) = uVar3;
    *(ulong *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x48) = local_68;
    local_60._M_id._M_thread = (id)0;
    local_80 = (long *)operator_new(0x20);
    *local_80 = (long)&PTR___State_001519d8;
    local_80[1] = (long)&p_Var1->_M_impl;
    local_80[2] = (long)std::__future_base::
                        _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DigitalInBlue[P]Celero/src/ThreadTestFixture.cpp:58:36)>_>,_void>
                        ::_M_run;
    local_80[3] = 0;
    std::thread::_M_start_thread(&local_60,&local_80,0);
    if (local_80 != (long *)0x0) {
      (**(code **)(*local_80 + 8))();
    }
    std::thread::operator=
              ((thread *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x20),&local_60);
    std::thread::~thread(&local_60);
    local_98._M_ptr = (pointer)0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DigitalInBlue[P]Celero/src/ThreadTestFixture.cpp:58:36)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DigitalInBlue[P]Celero/src/ThreadTestFixture.cpp:58:36)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr(&local_98);
    local_58 = 0;
    _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_98._M_alloc =
         (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DigitalInBlue[P]Celero_src_ThreadTestFixture_cpp:58:36)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DigitalInBlue[P]Celero_src_ThreadTestFixture_cpp:58:36)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
          *)local_b8[0].
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_98._M_ptr =
         (pointer)local_b8[0].
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    local_b8[0].super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)&p_Var1->_M_impl;
    local_b8[0].super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98._M_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
    if (local_b8[0].
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      p_Var1 = (pointer)operator_new(0x50);
      local_78._M_alloc = &__a2_1;
      (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00151a18;
      *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 8) = 0;
      *(undefined4 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x10) = 0;
      (p_Var1->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
      *(undefined4 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x18) = 0;
      (p_Var1->_M_impl)._M_storage._M_storage.__align =
           (anon_struct_8_0_00000001_for___align)&PTR___Deferred_state_00151a68;
      local_78._M_ptr = (pointer)p_Var1;
      p_Var2 = (_Result<void> *)operator_new(0x10);
      *(undefined8 *)p_Var2 = 0;
      *(undefined8 *)&p_Var2->field_0x8 = 0;
      std::__future_base::_Result<void>::_Result(p_Var2);
      *(_Result<void> **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x20) = p_Var2;
      *(ThreadTestFixture **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x28) = this;
      *(uint64_t *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x30) = uVar3;
      *(ulong *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x38) = local_68;
      local_78._M_ptr = (pointer)0x0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DigitalInBlue[P]Celero/src/ThreadTestFixture.cpp:58:36)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DigitalInBlue[P]Celero/src/ThreadTestFixture.cpp:58:36)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr(&local_78);
      local_98._M_alloc =
           (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DigitalInBlue[P]Celero_src_ThreadTestFixture_cpp:58:36)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DigitalInBlue[P]Celero_src_ThreadTestFixture_cpp:58:36)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
            *)0x0;
      local_98._M_ptr = (pointer)0x0;
      local_78._M_alloc =
           (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DigitalInBlue[P]Celero_src_ThreadTestFixture_cpp:58:36)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DigitalInBlue[P]Celero_src_ThreadTestFixture_cpp:58:36)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
            *)local_b8[0].
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
      local_78._M_ptr =
           (pointer)local_b8[0].
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      local_b8[0].super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)&p_Var1->_M_impl;
      local_b8[0].super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_ptr);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98._M_ptr);
    }
    std::__basic_future<void>::__basic_future(&local_40,local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_b8[0].
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::vector<std::future<void>,std::allocator<std::future<void>>>::
    emplace_back<std::future<void>>
              ((vector<std::future<void>,std::allocator<std::future<void>>> *)this_00._M_head_impl,
               (future<void> *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_40._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void ThreadTestFixture::startThreads(uint64_t threads, uint64_t iterations)
{
	const uint64_t iterationsPerThread = iterations / threads;

	for(uint64_t i = 0; i < threads; ++i)
	{
		try
		{
			this->pimpl->futures.push_back(
				// std::async(std::launch::deferred,
				std::async(std::launch::async, [this, i, iterationsPerThread]() {
					this->pimpl->currentThreadId = i + 1;
					for(auto threadIterationCounter = size_t(0); threadIterationCounter < iterationsPerThread;)
					{
						this->pimpl->currentCallId = ++threadIterationCounter;
						this->UserBenchmark();
					}
				}));
		}
		catch(std::system_error& e)
		{
			std::cerr << "ERROR: Exception. Error Code: " << e.code() << ", " << e.what() << std::endl;
		}
	}
}